

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_vsh_texture(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); vT = aT; }"
  ;
}

Assistant:

inline const char *openglrenderer_vsh_texture() { return RENGINE_GLSL(
    attribute highp vec2 aV;
    attribute highp vec2 aT;
    uniform highp mat4 m;
    varying highp vec2 vT;
    void main() {
        gl_Position = m * vec4(aV, 0, 1);
        vT = aT;
    }
); }